

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  undefined1 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  pointer psVar4;
  counters *this_01;
  size_type *psVar5;
  undefined8 uVar6;
  int val;
  int iVar7;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar8;
  char *pcVar9;
  pointer psVar10;
  int iVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *__s;
  size_type **ppsVar14;
  uint uVar15;
  piece_index_t pVar16;
  long lVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *this_03;
  bool bVar18;
  span<const_char> buf;
  size_type *local_78;
  string bitfield_string;
  ulong local_50;
  
  ppsVar14 = &local_78;
  this_03 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_02 = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var3->_M_use_count;
      do {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar7 == 0) break;
        LOCK();
        iVar11 = p_Var3->_M_use_count;
        bVar18 = iVar7 == iVar11;
        if (bVar18) {
          p_Var3->_M_use_count = iVar7 + 1;
          iVar11 = iVar7;
        }
        iVar7 = iVar11;
        UNLOCK();
        this_02 = p_Var3;
      } while (!bVar18);
    }
  }
  if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_03 = (torrent *)0x0;
  }
  else if (this_02->_M_use_count == 0) {
    this_03 = (torrent *)0x0;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  if ((this_03->field_0x5cc & 8) == 0) {
    if ((((this->super_peer_connection).field_0x889 & 4) == 0) ||
       (bVar18 = torrent::is_seed(this_03), !bVar18)) {
      if ((((this->super_peer_connection).field_0x889 & 4) == 0) ||
         (iVar7 = torrent::num_have(this_03), iVar7 != 0)) {
        iVar7 = torrent::num_have(this_03);
        if (iVar7 == 0) {
          peer_connection::peer_log
                    (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, have none")
          ;
          puVar2 = &(this->super_peer_connection).field_0x889;
          *puVar2 = *puVar2 | 8;
          ppsVar14 = &local_78;
        }
        else {
          iVar7 = (((this_03->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_num_pieces;
          lVar17 = (long)iVar7;
          iVar11 = iVar7 + 0xe;
          if (-1 < iVar7 + 7) {
            iVar11 = iVar7 + 7;
          }
          uVar15 = iVar11 >> 3;
          uVar12 = (ulong)(int)(uVar15 + 5);
          if (lVar17 < 0x7fd9) {
            local_50 = 0;
            pcVar9 = (char *)0x0;
            if (-0x2f < iVar7) {
              ppsVar14 = (size_type **)((long)&local_78 - (uVar12 + 0xf & 0x1fffffff0));
              pcVar9 = (char *)ppsVar14;
              local_50 = uVar12;
            }
          }
          else {
            pcVar9 = (char *)operator_new__(uVar12);
            ppsVar14 = &local_78;
            local_50 = uVar12;
          }
          if (pcVar9 != (char *)0x0) {
            iVar11 = 0x18;
            __s = (byte *)(pcVar9 + 1);
            do {
              pbVar13 = __s;
              pbVar13[-1] = (byte)((int)(uVar15 + 1) >> ((byte)iVar11 & 0x1f));
              __s = pbVar13 + 1;
              iVar11 = iVar11 + -8;
            } while (iVar11 != -8);
            *pbVar13 = 5;
            *(char *)((long)ppsVar14 + -8) = -0x38;
            *(char *)((long)ppsVar14 + -7) = -9;
            *(char *)((long)ppsVar14 + -6) = '\x18';
            *(char *)((long)ppsVar14 + -5) = '\0';
            *(char *)((long)ppsVar14 + -4) = '\0';
            *(char *)((long)ppsVar14 + -3) = '\0';
            *(char *)((long)ppsVar14 + -2) = '\0';
            *(char *)((long)ppsVar14 + -1) = '\0';
            bVar18 = torrent::is_seed(this_03);
            bitfield_string.field_2._8_8_ = lVar17;
            if (bVar18) {
              if (0 < iVar7) {
                *(char *)((long)ppsVar14 + -8) = -0x1b;
                *(char *)((long)ppsVar14 + -7) = -9;
                *(char *)((long)ppsVar14 + -6) = '\x18';
                *(char *)((long)ppsVar14 + -5) = '\0';
                *(char *)((long)ppsVar14 + -4) = '\0';
                *(char *)((long)ppsVar14 + -3) = '\0';
                *(char *)((long)ppsVar14 + -2) = '\0';
                *(char *)((long)ppsVar14 + -1) = '\0';
                memset(__s,0xff,(ulong)uVar15);
              }
              pcVar9[local_50 - 1] = (char)(0xff << (-(char)iVar7 & 7U));
            }
            else {
              pVar16.m_val = 0;
              *(char *)((long)ppsVar14 + -8) = '#';
              *(char *)((long)ppsVar14 + -7) = -8;
              *(char *)((long)ppsVar14 + -6) = '\x18';
              *(char *)((long)ppsVar14 + -5) = '\0';
              *(char *)((long)ppsVar14 + -4) = '\0';
              *(char *)((long)ppsVar14 + -3) = '\0';
              *(char *)((long)ppsVar14 + -2) = '\0';
              *(char *)((long)ppsVar14 + -1) = '\0';
              memset(__s,0,(long)(int)uVar15);
              if (0 < iVar7) {
                this_00._M_head_impl =
                     (this_03->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
                uVar15 = 0x80;
                do {
                  *(char *)((long)ppsVar14 + -8) = '=';
                  *(char *)((long)ppsVar14 + -7) = -8;
                  *(char *)((long)ppsVar14 + -6) = '\x18';
                  *(char *)((long)ppsVar14 + -5) = '\0';
                  *(char *)((long)ppsVar14 + -4) = '\0';
                  *(char *)((long)ppsVar14 + -3) = '\0';
                  *(char *)((long)ppsVar14 + -2) = '\0';
                  *(char *)((long)ppsVar14 + -1) = '\0';
                  bVar18 = piece_picker::have_piece(this_00._M_head_impl,pVar16);
                  if (bVar18) {
                    *__s = *__s | (byte)uVar15;
                  }
                  __s = __s + (uVar15 < 2);
                  bVar18 = uVar15 < 2;
                  uVar15 = (int)uVar15 >> 1;
                  if (bVar18) {
                    uVar15 = 0x80;
                  }
                  pVar16.m_val = pVar16.m_val + 1;
                } while (bitfield_string.field_2._8_4_ != pVar16.m_val);
              }
            }
            psVar4 = (this_03->m_predictive_pieces).
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar10 = (this_03->m_predictive_pieces).
                           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar4;
                psVar10 = psVar10 + 1) {
              iVar7 = psVar10->m_val;
              iVar11 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar11 = iVar7;
              }
              pcVar9[(long)(iVar11 >> 3) + 5] =
                   pcVar9[(long)(iVar11 >> 3) + 5] | (byte)(0x80 >> ((byte)iVar7 & 7));
            }
            *(char *)((long)ppsVar14 + -8) = -0x44;
            *(char *)((long)ppsVar14 + -7) = -8;
            *(char *)((long)ppsVar14 + -6) = '\x18';
            *(char *)((long)ppsVar14 + -5) = '\0';
            *(char *)((long)ppsVar14 + -4) = '\0';
            *(char *)((long)ppsVar14 + -3) = '\0';
            *(char *)((long)ppsVar14 + -2) = '\0';
            *(char *)((long)ppsVar14 + -1) = '\0';
            bVar18 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
            uVar6 = bitfield_string.field_2._8_8_;
            if (bVar18) {
              bitfield_string._M_dataplus._M_p = (pointer)0x0;
              bitfield_string._M_string_length._0_1_ = 0;
              local_78 = &bitfield_string._M_string_length;
              *(char *)((long)ppsVar14 + -8) = -0x16;
              *(char *)((long)ppsVar14 + -7) = -8;
              *(char *)((long)ppsVar14 + -6) = '\x18';
              *(char *)((long)ppsVar14 + -5) = '\0';
              *(char *)((long)ppsVar14 + -4) = '\0';
              *(char *)((long)ppsVar14 + -3) = '\0';
              *(char *)((long)ppsVar14 + -2) = '\0';
              *(char *)((long)ppsVar14 + -1) = '\0';
              ::std::__cxx11::string::resize((ulong)&local_78,(char)uVar6);
              psVar5 = local_78;
              if ((int)uVar6 != 0) {
                lVar17 = 0;
                do {
                  iVar7 = (int)lVar17;
                  iVar11 = iVar7 + 7;
                  if (-1 < iVar7) {
                    iVar11 = iVar7;
                  }
                  *(byte *)((long)local_78 + lVar17) =
                       (byte)~(pcVar9[(long)(iVar11 >> 3) + 5] << ((byte)lVar17 & 7)) >> 7 ^ 0x31;
                  lVar17 = lVar17 + 1;
                } while (uVar6 != lVar17);
              }
              *(char *)((long)ppsVar14 + -8) = 'G';
              *(char *)((long)ppsVar14 + -7) = -7;
              *(char *)((long)ppsVar14 + -6) = '\x18';
              *(char *)((long)ppsVar14 + -5) = '\0';
              *(char *)((long)ppsVar14 + -4) = '\0';
              *(char *)((long)ppsVar14 + -3) = '\0';
              *(char *)((long)ppsVar14 + -2) = '\0';
              *(char *)((long)ppsVar14 + -1) = '\0';
              peer_connection::peer_log
                        (&this->super_peer_connection,outgoing_message,"BITFIELD","%s",psVar5);
              psVar5 = local_78;
              if (local_78 != &bitfield_string._M_string_length) {
                lVar17 = CONCAT71(bitfield_string._M_string_length._1_7_,
                                  (undefined1)bitfield_string._M_string_length);
                *(char *)((long)ppsVar14 + -8) = '\\';
                *(char *)((long)ppsVar14 + -7) = -7;
                *(char *)((long)ppsVar14 + -6) = '\x18';
                *(char *)((long)ppsVar14 + -5) = '\0';
                *(char *)((long)ppsVar14 + -4) = '\0';
                *(char *)((long)ppsVar14 + -3) = '\0';
                *(char *)((long)ppsVar14 + -2) = '\0';
                *(char *)((long)ppsVar14 + -1) = '\0';
                operator_delete(psVar5,lVar17 + 1);
              }
            }
            puVar2 = &(this->super_peer_connection).field_0x889;
            *puVar2 = *puVar2 | 8;
            *(char *)((long)ppsVar14 + -8) = 't';
            *(char *)((long)ppsVar14 + -7) = -7;
            *(char *)((long)ppsVar14 + -6) = '\x18';
            *(char *)((long)ppsVar14 + -5) = '\0';
            *(char *)((long)ppsVar14 + -4) = '\0';
            *(char *)((long)ppsVar14 + -3) = '\0';
            *(char *)((long)ppsVar14 + -2) = '\0';
            *(char *)((long)ppsVar14 + -1) = '\0';
            buf.m_len = local_50;
            buf.m_ptr = pcVar9;
            peer_connection::send_buffer(&this->super_peer_connection,buf);
            this_01 = (this->super_peer_connection).m_counters;
            *(char *)((long)ppsVar14 + -8) = -0x72;
            *(char *)((long)ppsVar14 + -7) = -7;
            *(char *)((long)ppsVar14 + -6) = '\x18';
            *(char *)((long)ppsVar14 + -5) = '\0';
            *(char *)((long)ppsVar14 + -4) = '\0';
            *(char *)((long)ppsVar14 + -3) = '\0';
            *(char *)((long)ppsVar14 + -2) = '\0';
            *(char *)((long)ppsVar14 + -1) = '\0';
            counters::inc_stats_counter(this_01,0x5a,1);
          }
          if (0x1000 < (long)local_50 && pcVar9 != (char *)0x0) {
            *(char *)((long)ppsVar14 + -8) = -0x54;
            *(char *)((long)ppsVar14 + -7) = -7;
            *(char *)((long)ppsVar14 + -6) = '\x18';
            *(char *)((long)ppsVar14 + -5) = '\0';
            *(char *)((long)ppsVar14 + -4) = '\0';
            *(char *)((long)ppsVar14 + -3) = '\0';
            *(char *)((long)ppsVar14 + -2) = '\0';
            *(char *)((long)ppsVar14 + -1) = '\0';
            operator_delete__(pcVar9);
          }
        }
      }
      else {
        write_have_none(this);
        ppsVar14 = &local_78;
      }
    }
    else {
      write_have_all(this);
      ppsVar14 = &local_78;
    }
  }
  else {
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    if (((this->super_peer_connection).field_0x889 & 4) != 0) {
      write_have_none(this);
    }
    puVar2 = &(this->super_peer_connection).field_0x889;
    *puVar2 = *puVar2 | 8;
    ptVar8 = peer_connection::get_bitfield(&this->super_peer_connection);
    pVar16 = torrent::get_piece_to_super_seed(this_03,ptVar8);
    if (-1 < pVar16.m_val) {
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar16);
    }
    ptVar8 = peer_connection::get_bitfield(&this->super_peer_connection);
    pVar16 = torrent::get_piece_to_super_seed(this_03,ptVar8);
    ppsVar14 = &local_78;
    if (-1 < pVar16.m_val) {
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar16);
      ppsVar14 = &local_78;
    }
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)((long)ppsVar14 + -8) = 0x18f9b9;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		aux::write_int32(packet_size - 4, ptr);
		aux::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			auto const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}